

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

uint32_t helper_float_add_s_mips64el(CPUMIPSState_conflict10 *env,uint32_t fst0,uint32_t fst1)

{
  float32 fVar1;
  uintptr_t unaff_retaddr;
  uint32_t wt2;
  uint32_t fst1_local;
  uint32_t fst0_local;
  CPUMIPSState_conflict10 *env_local;
  
  fVar1 = float32_add_mips64el(fst0,fst1,&(env->active_fpu).fp_status);
  update_fcr31(env,unaff_retaddr);
  return fVar1;
}

Assistant:

FLOAT_BINOP(add)
FLOAT_BINOP(sub)
FLOAT_BINOP(mul)
FLOAT_BINOP(div)
#undef FLOAT_BINOP

/* MIPS specific binary operations */
uint64_t helper_float_recip2_d(CPUMIPSState *env, uint64_t fdt0, uint64_t fdt2)
{
    fdt2 = float64_mul(fdt0, fdt2, &env->active_fpu.fp_status);
    fdt2 = float64_chs(float64_sub(fdt2, float64_one,
                                   &env->active_fpu.fp_status));
    update_fcr31(env, GETPC());
    return fdt2;
}